

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

void __thiscall
CScriptNum::CScriptNum
          (CScriptNum *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vch,
          bool fRequireMinimal,size_t nMaxNumSize)

{
  byte bVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_type sVar4;
  byte *pbVar5;
  string *str;
  int64_t iVar6;
  char *in_RCX;
  byte in_DL;
  int64_t *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff58;
  scriptnum_error *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  scriptnum_error local_4a [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  pcVar2 = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             (in_stack_ffffffffffffff48);
  if (in_RCX < pcVar2) {
    uVar3 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_ffffffffffffff98),in_RCX,in_stack_ffffffffffffff88);
    scriptnum_error::scriptnum_error
              ((scriptnum_error *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar3,&scriptnum_error::typeinfo,scriptnum_error::~scriptnum_error);
    }
    goto LAB_001c4059;
  }
  if ((((bVar1 & 1) == 0) ||
      (sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         (in_stack_ffffffffffffff48), sVar4 == 0)) ||
     (pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                         (in_stack_ffffffffffffff48), (*pbVar5 & 0x7f) != 0)) {
LAB_001c3ffe:
    iVar6 = set_vch(in_stack_ffffffffffffff70);
    *in_RDI = iVar6;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (in_stack_ffffffffffffff48);
    if (1 < sVar4) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_ffffffffffffff48);
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
      if ((*pbVar5 & 0x80) != 0) goto LAB_001c3ffe;
    }
    str = (string *)__cxa_allocate_exception(0x10);
    this_00 = local_4a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_ffffffffffffff98),in_RCX,in_stack_ffffffffffffff88);
    scriptnum_error::scriptnum_error(this_00,str);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(str,&scriptnum_error::typeinfo,scriptnum_error::~scriptnum_error);
    }
  }
LAB_001c4059:
  __stack_chk_fail();
}

Assistant:

explicit CScriptNum(const std::vector<unsigned char>& vch, bool fRequireMinimal,
                        const size_t nMaxNumSize = nDefaultMaxNumSize)
    {
        if (vch.size() > nMaxNumSize) {
            throw scriptnum_error("script number overflow");
        }
        if (fRequireMinimal && vch.size() > 0) {
            // Check that the number is encoded with the minimum possible
            // number of bytes.
            //
            // If the most-significant-byte - excluding the sign bit - is zero
            // then we're not minimal. Note how this test also rejects the
            // negative-zero encoding, 0x80.
            if ((vch.back() & 0x7f) == 0) {
                // One exception: if there's more than one byte and the most
                // significant bit of the second-most-significant-byte is set
                // it would conflict with the sign bit. An example of this case
                // is +-255, which encode to 0xff00 and 0xff80 respectively.
                // (big-endian).
                if (vch.size() <= 1 || (vch[vch.size() - 2] & 0x80) == 0) {
                    throw scriptnum_error("non-minimally encoded script number");
                }
            }
        }
        m_value = set_vch(vch);
    }